

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testUseRoleMask(tst_RoleMaskProxyModel *this)

{
  bool userRoleEditable;
  QAbstractItemModel *parent;
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  ModelTest *this_00;
  iterator iVar7;
  iterator iVar8;
  RoleMaskProxyModel proxyModel;
  QModelIndexList magicNumerIndexes;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QModelIndex local_50;
  
  iVar3 = qMetaTypeId<QAbstractItemModel*>();
  puVar4 = (undefined8 *)QTest::qData("baseModel",iVar3);
  parent = (QAbstractItemModel *)*puVar4;
  if (parent != (QAbstractItemModel *)0x0) {
    iVar3 = qMetaTypeId<QList<QModelIndex>>();
    plVar5 = (long *)QTest::qData("magicNumerIndexes",iVar3);
    magicNumerIndexes.d.d = (Data *)*plVar5;
    magicNumerIndexes.d.ptr = (QModelIndex *)plVar5[1];
    magicNumerIndexes.d.size = plVar5[2];
    if (magicNumerIndexes.d.d != (Data *)0x0) {
      LOCK();
      ((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((magicNumerIndexes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    uVar6 = QTest::qData("userRoleEditable",1);
    userRoleEditable = *(bool *)uVar6;
    RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,(QObject *)parent);
    RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
    RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
    iVar7 = QList<QModelIndex>::begin(&magicNumerIndexes);
    iVar8 = QList<QModelIndex>::end(&magicNumerIndexes);
    do {
      if (iVar7.i == iVar8.i) {
        local_50.r = -1;
        local_50.c = -1;
        local_50.i = 0;
        local_50.m = (QAbstractItemModel *)0x0;
        local_68._forAlignment = -NAN;
        local_68._8_8_ = 0;
        local_68._16_8_ = 0;
        testUseRoleMaskRecurse
                  (this,0xbfdd2,parent,&proxyModel,&magicNumerIndexes,userRoleEditable,&local_50,
                   (QModelIndex *)&local_68);
        QObject::deleteLater();
        break;
      }
      QIdentityProxyModel::mapFromSource((QModelIndex *)&local_68);
      QVariant::QVariant((QVariant *)&local_50,0xbfdd2);
      bVar1 = (bool)RoleMaskProxyModel::setData
                              ((QModelIndex *)&proxyModel,(QVariant *)&local_68,(int)&local_50);
      cVar2 = QTest::qVerify(bVar1,
                             "proxyModel.setData(proxyModel.mapFromSource(singleIdx), magicNumber, Qt::UserRole)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x89);
      QVariant::~QVariant((QVariant *)&local_50);
      if (cVar2 == '\0') break;
      QVariant::QVariant((QVariant *)&local_50,-0xbfdd3);
      cVar2 = (**(code **)(*(long *)parent + 0x98))(parent,iVar7.i,&local_50,0x100);
      cVar2 = QTest::qVerify(userRoleEditable == (bool)cVar2,
                             "userRoleEditable == baseModel->setData(singleIdx, ~magicNumber, Qt::UserRole)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x8a);
      QVariant::~QVariant((QVariant *)&local_50);
      iVar7.i = iVar7.i + 1;
    } while (cVar2 != '\0');
    RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&magicNumerIndexes.d);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMask()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(QModelIndexList, magicNumerIndexes);
    QFETCH(bool, userRoleEditable);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(baseModel);
    const int magicNumber = 785874;
    for (const QModelIndex &singleIdx : magicNumerIndexes) {
        QVERIFY(proxyModel.setData(proxyModel.mapFromSource(singleIdx), magicNumber, Qt::UserRole));
        QVERIFY(userRoleEditable == baseModel->setData(singleIdx, ~magicNumber, Qt::UserRole));
    }
    testUseRoleMaskRecurse(magicNumber, baseModel, &proxyModel, magicNumerIndexes, userRoleEditable);
    baseModel->deleteLater();
}